

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall
RPCResult::ToSections(RPCResult *this,Sections *sections,OuterType outer_type,int current_indent)

{
  long lVar1;
  pointer pRVar2;
  string_view func;
  string_view func_00;
  NonFatalCheckError *this_00;
  char *__s;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  RPCResult *i;
  pointer pRVar3;
  int current_indent_00;
  long in_FS_OFFSET;
  string_view msg;
  string_view msg_00;
  string_view file;
  string_view file_00;
  allocator<char> local_1b1;
  undefined8 local_1b0;
  char *pcStack_1a8;
  anon_class_8_1_8991fb9c Description;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Section local_f8;
  string maybe_key;
  string maybe_separator;
  string indent_next;
  string indent;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&indent,(long)current_indent,' ');
  current_indent_00 = current_indent + 2;
  indent_next._M_dataplus._M_p = (pointer)&indent_next.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&indent_next,(long)current_indent_00,' ');
  __s = ",";
  if (outer_type == NONE) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maybe_separator,__s,(allocator<char> *)&local_f8);
  if (outer_type == OBJ) {
    std::operator+(&local_f8.m_left,"\"",&this->m_key_name);
    std::operator+(&maybe_key,&local_f8.m_left,"\" : ");
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maybe_key,"",(allocator<char> *)&local_f8);
  }
  Description.this = this;
  switch(this->m_type) {
  case OBJ:
  case OBJ_DYN:
    if ((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator+(&local_138,&indent,&maybe_key);
      std::operator+(&local_118,&local_138,"{}");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"empty JSON object",(allocator<char> *)&local_198);
      ToSections::anon_class_8_1_8991fb9c::operator()(&local_158,&Description,&local_178);
      Section::Section(&local_f8,&local_118,&local_158);
      Sections::PushSection(sections,&local_f8);
      goto LAB_005b74f2;
    }
    std::operator+(&local_138,&indent,&maybe_key);
    std::operator+(&local_118,&local_138,"{");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"json object",(allocator<char> *)&local_198);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_158,&Description,&local_178);
    Section::Section(&local_f8,&local_118,&local_158);
    Sections::PushSection(sections,&local_f8);
    Section::~Section(&local_f8);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    pRVar2 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar3 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                  super__Vector_impl_data._M_start; pRVar3 != pRVar2; pRVar3 = pRVar3 + 1) {
      ToSections(pRVar3,sections,OBJ,current_indent_00);
    }
    if ((this->m_type == OBJ_DYN) &&
       ((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].m_type != ELISION)) {
      std::operator+(&local_118,&indent_next,"...");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_158);
      Section::Section(&local_f8,&local_118,&local_138);
      Sections::PushSection(sections,&local_f8);
      Section::~Section(&local_f8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&(sections->m_sections).super__Vector_base<Section,_std::allocator<Section>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].m_left);
    }
    std::operator+(&local_138,&indent,"}");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"",(allocator<char> *)&local_178);
    Section::Section(&local_f8,&local_118,&local_158);
    Sections::PushSection(sections,&local_f8);
    goto LAB_005b7731;
  case ARR:
  case ARR_FIXED:
    std::operator+(&local_138,&indent,&maybe_key);
    std::operator+(&local_118,&local_138,"[");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"json array",(allocator<char> *)&local_198);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_158,&Description,&local_178);
    Section::Section(&local_f8,&local_118,&local_158);
    Sections::PushSection(sections,&local_f8);
    Section::~Section(&local_f8);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    pRVar2 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar3 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                  super__Vector_impl_data._M_start; pRVar3 != pRVar2; pRVar3 = pRVar3 + 1) {
      ToSections(pRVar3,sections,ARR,current_indent_00);
    }
    local_f8.m_left._M_dataplus._M_p._0_1_ =
         (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
         super__Vector_impl_data._M_finish;
    inline_check_non_fatal<bool>
              ((bool *)&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
               ,0x42a,"ToSections","!m_inner.empty()");
    if ((this->m_type == ARR) &&
       ((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].m_type != ELISION)) {
      std::operator+(&local_118,&indent_next,"...");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_158);
      Section::Section(&local_f8,&local_118,&local_138);
      Sections::PushSection(sections,&local_f8);
      Section::~Section(&local_f8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&(sections->m_sections).super__Vector_base<Section,_std::allocator<Section>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].m_left);
    }
    std::operator+(&local_138,&indent,"]");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"",(allocator<char> *)&local_178);
    Section::Section(&local_f8,&local_118,&local_158);
    Sections::PushSection(sections,&local_f8);
LAB_005b7731:
    Section::~Section(&local_f8);
    this_01 = &local_158;
LAB_005b7746:
    std::__cxx11::string::~string((string *)this_01);
LAB_005b774b:
    std::__cxx11::string::~string((string *)&local_118);
    this_02 = &local_138;
    goto LAB_005b7760;
  case STR:
    std::operator+(&local_158,&indent,&maybe_key);
    std::operator+(&local_138,&local_158,"\"str\"");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"string",&local_1b1);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&Description,&local_198);
    Section::Section(&local_f8,&local_118,&local_178);
    Sections::PushSection(sections,&local_f8);
    break;
  case NUM:
    std::operator+(&local_158,&indent,&maybe_key);
    std::operator+(&local_138,&local_158,"n");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"numeric",&local_1b1);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&Description,&local_198);
    Section::Section(&local_f8,&local_118,&local_178);
    Sections::PushSection(sections,&local_f8);
    break;
  case BOOL:
    std::operator+(&local_158,&indent,&maybe_key);
    std::operator+(&local_138,&local_158,"true|false");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"boolean",&local_1b1);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&Description,&local_198);
    Section::Section(&local_f8,&local_118,&local_178);
    Sections::PushSection(sections,&local_f8);
    break;
  case NONE:
    std::operator+(&local_138,&indent,"null");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"json null",(allocator<char> *)&local_198);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_158,&Description,&local_178);
    Section::Section(&local_f8,&local_118,&local_158);
    Sections::PushSection(sections,&local_f8);
LAB_005b74f2:
    Section::~Section(&local_f8);
    std::__cxx11::string::~string((string *)&local_158);
    this_01 = &local_178;
    goto LAB_005b7746;
  case ANY:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    local_1b0 = 10;
    pcStack_1a8 = "ToSections";
    func_00._M_str = "ToSections";
    func_00._M_len = 10;
    msg_00._M_str = "Unreachable code reached (non-fatal)";
    msg_00._M_len = 0x24;
    file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
    file_00._M_len = 0x55;
    NonFatalCheckError::NonFatalCheckError(this_00,msg_00,file_00,0x406,func_00);
    goto LAB_005b785a;
  case STR_AMOUNT:
    std::operator+(&local_158,&indent,&maybe_key);
    std::operator+(&local_138,&local_158,"n");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"numeric",&local_1b1);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&Description,&local_198);
    Section::Section(&local_f8,&local_118,&local_178);
    Sections::PushSection(sections,&local_f8);
    break;
  case STR_HEX:
    std::operator+(&local_158,&indent,&maybe_key);
    std::operator+(&local_138,&local_158,"\"hex\"");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"string",&local_1b1);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&Description,&local_198);
    Section::Section(&local_f8,&local_118,&local_178);
    Sections::PushSection(sections,&local_f8);
    break;
  case NUM_TIME:
    std::operator+(&local_158,&indent,&maybe_key);
    std::operator+(&local_138,&local_158,"xxx");
    std::operator+(&local_118,&local_138,&maybe_separator);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"numeric",&local_1b1);
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&Description,&local_198);
    Section::Section(&local_f8,&local_118,&local_178);
    Sections::PushSection(sections,&local_f8);
    break;
  case ELISION:
    std::operator+(&local_138,&indent,"...");
    std::operator+(&local_118,&local_138,&maybe_separator);
    Section::Section(&local_f8,&local_118,&this->m_description);
    Sections::PushSection(sections,&local_f8);
    Section::~Section(&local_f8);
    goto LAB_005b774b;
  default:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func._M_str = "ToSections";
    func._M_len = 10;
    msg._M_str = "Unreachable code reached (non-fatal)";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
    file._M_len = 0x55;
    NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x449,func);
LAB_005b785a:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_005b7cb2;
  }
  Section::~Section(&local_f8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  this_02 = &local_158;
LAB_005b7760:
  std::__cxx11::string::~string((string *)this_02);
  std::__cxx11::string::~string((string *)&maybe_key);
  std::__cxx11::string::~string((string *)&maybe_separator);
  std::__cxx11::string::~string((string *)&indent_next);
  std::__cxx11::string::~string((string *)&indent);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_005b7cb2:
  __stack_chk_fail();
}

Assistant:

void RPCResult::ToSections(Sections& sections, const OuterType outer_type, const int current_indent) const
{
    // Indentation
    const std::string indent(current_indent, ' ');
    const std::string indent_next(current_indent + 2, ' ');

    // Elements in a JSON structure (dictionary or array) are separated by a comma
    const std::string maybe_separator{outer_type != OuterType::NONE ? "," : ""};

    // The key name if recursed into a dictionary
    const std::string maybe_key{
        outer_type == OuterType::OBJ ?
            "\"" + this->m_key_name + "\" : " :
            ""};

    // Format description with type
    const auto Description = [&](const std::string& type) {
        return "(" + type + (this->m_optional ? ", optional" : "") + ")" +
               (this->m_description.empty() ? "" : " " + this->m_description);
    };

    switch (m_type) {
    case Type::ELISION: {
        // If the inner result is empty, use three dots for elision
        sections.PushSection({indent + "..." + maybe_separator, m_description});
        return;
    }
    case Type::ANY: {
        NONFATAL_UNREACHABLE(); // Only for testing
    }
    case Type::NONE: {
        sections.PushSection({indent + "null" + maybe_separator, Description("json null")});
        return;
    }
    case Type::STR: {
        sections.PushSection({indent + maybe_key + "\"str\"" + maybe_separator, Description("string")});
        return;
    }
    case Type::STR_AMOUNT: {
        sections.PushSection({indent + maybe_key + "n" + maybe_separator, Description("numeric")});
        return;
    }
    case Type::STR_HEX: {
        sections.PushSection({indent + maybe_key + "\"hex\"" + maybe_separator, Description("string")});
        return;
    }
    case Type::NUM: {
        sections.PushSection({indent + maybe_key + "n" + maybe_separator, Description("numeric")});
        return;
    }
    case Type::NUM_TIME: {
        sections.PushSection({indent + maybe_key + "xxx" + maybe_separator, Description("numeric")});
        return;
    }
    case Type::BOOL: {
        sections.PushSection({indent + maybe_key + "true|false" + maybe_separator, Description("boolean")});
        return;
    }
    case Type::ARR_FIXED:
    case Type::ARR: {
        sections.PushSection({indent + maybe_key + "[", Description("json array")});
        for (const auto& i : m_inner) {
            i.ToSections(sections, OuterType::ARR, current_indent + 2);
        }
        CHECK_NONFATAL(!m_inner.empty());
        if (m_type == Type::ARR && m_inner.back().m_type != Type::ELISION) {
            sections.PushSection({indent_next + "...", ""});
        } else {
            // Remove final comma, which would be invalid JSON
            sections.m_sections.back().m_left.pop_back();
        }
        sections.PushSection({indent + "]" + maybe_separator, ""});
        return;
    }
    case Type::OBJ_DYN:
    case Type::OBJ: {
        if (m_inner.empty()) {
            sections.PushSection({indent + maybe_key + "{}", Description("empty JSON object")});
            return;
        }
        sections.PushSection({indent + maybe_key + "{", Description("json object")});
        for (const auto& i : m_inner) {
            i.ToSections(sections, OuterType::OBJ, current_indent + 2);
        }
        if (m_type == Type::OBJ_DYN && m_inner.back().m_type != Type::ELISION) {
            // If the dictionary keys are dynamic, use three dots for continuation
            sections.PushSection({indent_next + "...", ""});
        } else {
            // Remove final comma, which would be invalid JSON
            sections.m_sections.back().m_left.pop_back();
        }
        sections.PushSection({indent + "}" + maybe_separator, ""});
        return;
    }
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}